

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O1

void If_ManImproveNodeFaninUpdate(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  uint uVar2;
  If_Obj_t *pIVar3;
  long lVar4;
  void **ppvVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  if (((undefined1  [112])*pObj & (undefined1  [112])0xf) != (undefined1  [112])0x4) {
    __assert_fail("If_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifReduce.c"
                  ,0x13c,
                  "void If_ManImproveNodeFaninUpdate(If_Man_t *, If_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  uVar1 = vFront->nSize;
  lVar7 = (ulong)uVar1 + 1;
  do {
    if ((int)lVar7 + -1 < 1) {
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                    ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
    }
    lVar6 = lVar7 + -1;
    lVar4 = lVar7 + -2;
    lVar7 = lVar6;
  } while ((If_Obj_t *)vFront->pArray[lVar4] != pObj);
  for (; (int)lVar6 < (int)uVar1; lVar6 = lVar6 + 1) {
    vFront->pArray[lVar6 + -1] = vFront->pArray[lVar6];
  }
  vFront->nSize = uVar1 - 1;
  pIVar3 = pObj->pFanin0;
  if ((pIVar3->field_0x1 & 1) == 0) {
    uVar2 = vFront->nCap;
    if (uVar1 - 1 == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (vFront->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(vFront->pArray,0x80);
        }
        iVar8 = 0x10;
      }
      else {
        iVar8 = uVar2 * 2;
        if (iVar8 <= (int)uVar2) goto LAB_0040889f;
        if (vFront->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(vFront->pArray,(ulong)uVar2 << 4);
        }
      }
      vFront->pArray = ppvVar5;
      vFront->nCap = iVar8;
    }
LAB_0040889f:
    iVar8 = vFront->nSize;
    vFront->nSize = iVar8 + 1;
    vFront->pArray[iVar8] = pIVar3;
    uVar1 = vVisited->nCap;
    if (vVisited->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar5;
        iVar8 = 0x10;
      }
      else {
        iVar8 = uVar1 * 2;
        if (iVar8 <= (int)uVar1) goto LAB_00408927;
        if (vVisited->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
        }
        vVisited->pArray = ppvVar5;
      }
      vVisited->nCap = iVar8;
    }
LAB_00408927:
    iVar8 = vVisited->nSize;
    vVisited->nSize = iVar8 + 1;
    vVisited->pArray[iVar8] = pIVar3;
    pIVar3->field_0x1 = pIVar3->field_0x1 | 1;
  }
  pIVar3 = pObj->pFanin1;
  if ((pIVar3->field_0x1 & 1) != 0) {
    return;
  }
  uVar1 = vFront->nCap;
  if (vFront->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vFront->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vFront->pArray,0x80);
      }
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar1 * 2;
      if (iVar8 <= (int)uVar1) goto LAB_004089af;
      if (vFront->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vFront->pArray,(ulong)uVar1 << 4);
      }
    }
    vFront->pArray = ppvVar5;
    vFront->nCap = iVar8;
  }
LAB_004089af:
  iVar8 = vFront->nSize;
  vFront->nSize = iVar8 + 1;
  vFront->pArray[iVar8] = pIVar3;
  uVar1 = vVisited->nCap;
  if (vVisited->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vVisited->pArray,0x80);
      }
      vVisited->pArray = ppvVar5;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar1 * 2;
      if (iVar8 <= (int)uVar1) goto LAB_00408a37;
      if (vVisited->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
      }
      vVisited->pArray = ppvVar5;
    }
    vVisited->nCap = iVar8;
  }
LAB_00408a37:
  iVar8 = vVisited->nSize;
  vVisited->nSize = iVar8 + 1;
  vVisited->pArray[iVar8] = pIVar3;
  pIVar3->field_0x1 = pIVar3->field_0x1 | 1;
  return;
}

Assistant:

void If_ManImproveNodeFaninUpdate( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited )
{
    If_Obj_t * pFanin;
    assert( If_ObjIsAnd(pObj) );
    Vec_PtrRemove( vFront, pObj );
    pFanin = If_ObjFanin0(pObj);
    if ( !pFanin->fMark )
    {
        Vec_PtrPush( vFront, pFanin );
        Vec_PtrPush( vVisited, pFanin );
        pFanin->fMark = 1;
    }
    pFanin = If_ObjFanin1(pObj);
    if ( !pFanin->fMark )
    {
        Vec_PtrPush( vFront, pFanin );
        Vec_PtrPush( vVisited, pFanin );
        pFanin->fMark = 1;
    }
}